

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O1

wchar_t div_u16n(uint16_t *q,uint16_t *r,uint16_t *w,uint16_t *num,uint16_t *den,size_t nq,size_t n,
                size_t nd)

{
  bool bVar1;
  uint16_t *a;
  uint16_t uVar2;
  _Bool _Var3;
  wchar_t wVar4;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint16_t local_8c;
  uint16_t local_8a;
  size_t local_88;
  ulong local_80;
  uint16_t *local_78;
  ulong local_70;
  uint16_t *local_68;
  size_t local_60;
  uint16_t *local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_88 = nq;
  local_68 = q;
  local_58 = den;
  sVar5 = msb_u16n(den,nd);
  if (sVar5 == 0) {
    wVar4 = L'\x02';
  }
  else {
    local_60 = msb_u16n(num,n);
    local_70 = 1;
    if (sVar5 < local_60) {
      local_70 = (local_60 - sVar5) + 0xf >> 4;
    }
    if (n != 0) {
      sVar6 = 0;
      do {
        r[sVar6] = num[sVar6];
        sVar6 = sVar6 + 1;
      } while (n != sVar6);
    }
    local_80 = local_88;
    if (local_88 < local_70) {
      local_80 = local_70;
    }
    if (local_80 != 0) {
      local_40 = local_80 << 4;
      local_48 = sVar5 - 0x10;
      sVar5 = nd + 1;
      local_50 = n + 1;
      local_78 = r;
      do {
        if (local_60 < (ulong)(local_48 + local_40)) {
          if (local_80 <= local_88) {
            local_68[local_88 - local_80] = 0;
          }
        }
        else {
          local_8c = 0;
          uVar7 = (local_60 + 1) - (local_48 + local_40);
          if (uVar7 == 0) {
            __assert_fail("lo < hi - 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                          ,0x541,
                          "int div_u16n(uint16_t *, uint16_t *, uint16_t *, const uint16_t *, const uint16_t *, size_t, size_t, size_t)"
                         );
          }
          if (0xf < uVar7) {
            uVar7 = 0x10;
          }
          uVar10 = 1 << ((byte)uVar7 & 0x1f);
          uVar8 = 0;
          sVar6 = local_50 - local_80;
          local_38 = local_88 - local_80;
          do {
            uVar9 = (uVar8 & 0xffff) + uVar10 >> 1;
            local_8a = (uint16_t)uVar9;
            _Var3 = mul_u16n(w,local_58,&local_8a,sVar5,nd,1);
            if (_Var3) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                            ,0x548,
                            "int div_u16n(uint16_t *, uint16_t *, uint16_t *, const uint16_t *, const uint16_t *, size_t, size_t, size_t)"
                           );
            }
            wVar4 = cmp_u16n(local_78,w,sVar6,sVar5);
            uVar2 = (uint16_t)uVar9;
            if (wVar4 < L'\0') {
              uVar10 = uVar9 & 0xffff;
              uVar9 = uVar8;
              uVar2 = local_8c;
            }
            local_8c = uVar2;
            uVar8 = uVar9;
            if ((wVar4 == L'\0') || (bVar1 = true, uVar10 - 1 == (uVar8 & 0xffff))) {
              if (wVar4 < L'\0') {
                _Var3 = mul_u16n(w,local_58,&local_8c,sVar5,nd,1);
                if (_Var3) {
                  __assert_fail("!over",
                                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                                ,0x556,
                                "int div_u16n(uint16_t *, uint16_t *, uint16_t *, const uint16_t *, const uint16_t *, size_t, size_t, size_t)"
                               );
                }
                wVar4 = cmp_u16n(local_78,w,sVar6,sVar5);
                if (wVar4 < L'\0') {
                  __assert_fail("cmp_u16n(r, w, n - (iqr - 1), nd + 1) >= 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                                ,0x558,
                                "int div_u16n(uint16_t *, uint16_t *, uint16_t *, const uint16_t *, const uint16_t *, size_t, size_t, size_t)"
                               );
                }
              }
              a = local_78;
              if (local_80 <= local_88) {
                local_68[local_38] = (uint16_t)uVar8;
              }
              subip_u16n(local_78,w,sVar6,sVar5);
              local_60 = msb_u16n(a,n);
              bVar1 = false;
            }
          } while (bVar1);
        }
        local_40 = local_40 + -0x10;
        local_80 = local_80 - 1;
      } while (local_80 != 0);
    }
    wVar4 = (wchar_t)(local_88 < local_70);
  }
  return wVar4;
}

Assistant:

static int div_u16n(uint16_t *q, uint16_t *r, uint16_t *w, const uint16_t *num,
		const uint16_t *den, size_t nq, size_t n, size_t nd)
{
	size_t msb_d = msb_u16n(den, nd), msb_r;
	size_t nqu, ir, iqr, iqrb;

	if (msb_d == 0) {
		return 2;
	}
	msb_r = msb_u16n(num, n);
	if (msb_r > msb_d) {
		nqu = ((msb_r - msb_d) + 15) / 16;
	} else {
		nqu = 1;
	}

	for (ir = 0; ir < n; ++ir) {
		r[ir] = num[ir];
	}

	for (iqr = MAX(nq, nqu), iqrb = MAX(nq, nqu) * 16; iqr > 0;
			--iqr, iqrb -= 16) {
		uint16_t lo;
		uint32_t hi;
		bool redo_w;

		if (msb_d + iqrb - 16 > msb_r) {
			if (iqr <= nq) {
				q[nq - iqr] = 0;
			}
			continue;
		}
		/* Use binary search to determine the digit in the quotient. */
		lo = 0;
		hi = (uint32_t)1 << MIN(16, (msb_r - msb_d  + 1 - (iqrb - 16)));
		redo_w = true;
		assert (lo < hi - 1);
		while (1) {
			uint16_t try = (uint16_t)((lo + hi) / 2);
			bool over = mul_u16n(w, den, &try, nd + 1, nd, 1);
			int c;

			if (over) {
				assert(0);
			}
			c = cmp_u16n(r, w, n - (iqr - 1), nd + 1);
			if (c < 0) {
				hi = try;
				redo_w = true;
			} else {
				lo = try;
				redo_w = false;
			}
			if (!c || lo == hi - 1) {
				if (redo_w) {
					over = mul_u16n(w, den, &lo, nd + 1,
						nd, 1);
					assert(!over);
					assert(cmp_u16n(r, w, n - (iqr - 1),
						nd + 1) >= 0);
				}
				if (iqr <= nq) {
					q[nq - iqr] = lo;
				}
				subip_u16n(r, w, n - (iqr - 1), nd + 1);
				msb_r = msb_u16n(r, n);
				break;
			}
		}
	}
	return (nqu > nq) ? 1 : 0;
}